

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall imrt::Plan::writeIntensities(Plan *this,string *file,int n)

{
  int iVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  int angle5;
  int angle4;
  int angle3;
  int angle2;
  int angle1;
  double F;
  string line;
  ifstream myfile;
  
  std::ifstream::ifstream((string *)&myfile);
  std::ifstream::open((string *)&myfile,(_Ios_Openmode)file);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar1 = 0;
  if (0 < n) {
    iVar1 = n;
  }
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&myfile,(string *)&line);
  }
  std::istream::operator>>((istream *)&myfile,&angle1);
  std::istream::operator>>((istream *)&myfile,&angle2);
  std::istream::operator>>((istream *)&myfile,&angle3);
  std::istream::operator>>((istream *)&myfile,&angle4);
  std::istream::operator>>((istream *)&myfile,&angle5);
  std::istream::_M_extract<double>((double *)&myfile);
  p_Var2 = (_List_node_base *)&this->stations;
  while (p_Var2 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->stations) {
    Station::writeIntensity((Station *)p_Var2[1]._M_next,&myfile);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&myfile);
  return;
}

Assistant:

void Plan::writeIntensities(string file, int n) {
  	ifstream myfile;
  	myfile.open(file);

    std::string line;
    for(int i=0; i<n; i++) std::getline(myfile, line);

  	int angle1, angle2, angle3, angle4, angle5;
  	double F;
  	myfile >> angle1;
  	myfile >> angle2;
  	myfile >> angle3;
  	myfile >> angle4;
  	myfile >> angle5;
  	myfile >> F;

  	for(auto station:stations){
  		station->writeIntensity(myfile);
  	}

  }